

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O3

ImColor ImColor_HSV(ImColor *self,float h,float s,float v,float a)

{
  ImColor IVar1;
  float b;
  float g;
  float r;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  
  local_28 = a;
  ImGui::ColorConvertHSVtoRGB(h,s,v,&local_2c,&local_30,&local_34);
  IVar1.Value.y = local_30;
  IVar1.Value.x = local_2c;
  IVar1.Value.w = local_28;
  IVar1.Value.z = local_34;
  return (ImColor)IVar1.Value;
}

Assistant:

CIMGUI_API ImColor *_ImColor_HSV (ImColor *larg1, float larg2, float larg3, float larg4, float larg5) {
  ImColor * lresult = (ImColor *)0 ;
  ImColor *arg1 = (ImColor *) 0 ;
  float arg2 ;
  float arg3 ;
  float arg4 ;
  float arg5 ;
  ImColor result;
  
  arg1 = larg1;
  arg2 = larg2;
  arg3 = larg3;
  arg4 = larg4;
  arg5 = larg5;
  try {
    result = ImColor_HSV(arg1,arg2,arg3,arg4,arg5);
    lresult = new ImColor(result);
    return lresult;
  } catch (...) {
    return (ImColor *)0;
  }
}